

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

bool __thiscall google::protobuf::StringPiece::ConsumeFromEnd(StringPiece *this,StringPiece x)

{
  bool bVar1;
  
  bVar1 = ends_with(this,x);
  if (bVar1) {
    this->length_ = this->length_ - x.length_;
  }
  return bVar1;
}

Assistant:

bool StringPiece::ConsumeFromEnd(StringPiece x) {
  if (ends_with(x)) {
    length_ -= x.length_;
    return true;
  }
  return false;
}